

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int CalcDamageValue(VMFunction *func)

{
  VMOP *pVVar1;
  int iVar2;
  VMScriptFunction *pVVar3;
  
  if (func == (VMFunction *)0x0) {
    return 0;
  }
  pVVar3 = dyn_cast<VMScriptFunction>(&func->super_DObject);
  iVar2 = 0x40000000;
  if (pVVar3 != (VMScriptFunction *)0x0) {
    pVVar1 = pVVar3->Code;
    if ((pVVar1->field_0).op == '@') {
      if (((pVVar1->field_0).a == '\0') && ((pVVar1->field_0).b == '\x04')) {
        iVar2 = pVVar3->KonstD[(pVVar1->field_0).c];
      }
    }
    else if (((pVVar1->field_0).op == 'A') && ((pVVar1->field_0).a == '\0')) {
      iVar2 = (int)(short)(pVVar1->field_4).i16u;
    }
  }
  return iVar2;
}

Assistant:

static int CalcDamageValue(VMFunction *func)
{
	if (func == NULL)
	{
		return 0;
	}
	VMScriptFunction *sfunc = dyn_cast<VMScriptFunction>(func);
	if (sfunc == NULL)
	{
		return 0x40000000;
	}
	VMOP *op = sfunc->Code;
	// If the function was created by CreateDamageFunction(), extract
	// the value used to create it and return that. Otherwise, return
	// indicating to use the default function.
	if (op->op == OP_RETI && op->a == 0)
	{
		return op->i16;
	}
	if (op->op == OP_RET && op->a == 0 && op->b == (REGT_INT | REGT_KONST))
	{
		return sfunc->KonstD[op->c];
	}
	return 0x40000000;
}